

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

size_t testing::internal::GetThreadCount(void)

{
  Message *pMVar1;
  unsigned_long uVar2;
  __pid_t local_40 [4];
  Message local_30;
  undefined1 local_28 [8];
  string filename;
  
  Message::Message(&local_30);
  pMVar1 = Message::operator<<(&local_30,(char (*) [7])"/proc/");
  local_40[0] = getpid();
  pMVar1 = Message::operator<<(pMVar1,local_40);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [6])"/stat");
  Message::GetString_abi_cxx11_((string *)local_28,pMVar1);
  Message::~Message(&local_30);
  uVar2 = anon_unknown_32::ReadProcFileField<unsigned_long>((string *)local_28,0x13);
  std::__cxx11::string::~string((string *)local_28);
  return uVar2;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<size_t>(filename, 19);
}